

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O2

size_t Imf_2_5::bytesPerLineTable
                 (Header *header,vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine
                 )

{
  pointer puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Box2i *pBVar6;
  ChannelList *this;
  const_iterator cVar7;
  ConstIterator CVar8;
  size_t sVar9;
  int iVar10;
  ulong *puVar11;
  int iVar12;
  long lVar13;
  
  pBVar6 = Header::dataWindow(header);
  this = Header::channels(header);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (bytesPerLine,(long)(((pBVar6->max).y - (pBVar6->min).y) + 1));
  cVar7._M_node = (_Base_ptr)ChannelList::begin(this);
  while( true ) {
    CVar8 = ChannelList::end(this);
    if ((const_iterator)cVar7._M_node == CVar8._i._M_node) break;
    iVar5 = pixelTypeSize(cVar7._M_node[9]._M_color);
    iVar10 = (pBVar6->min).y;
    iVar2 = (pBVar6->max).x;
    iVar3 = (pBVar6->min).x;
    iVar4 = *(int *)&cVar7._M_node[9].field_0x4;
    for (lVar13 = 0; iVar12 = (int)lVar13 + iVar10, iVar12 <= (pBVar6->max).y; lVar13 = lVar13 + 1)
    {
      iVar12 = Imath_2_5::modp(iVar12,*(int *)&cVar7._M_node[9]._M_parent);
      if (iVar12 == 0) {
        puVar1 = (bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start + lVar13;
        *puVar1 = *puVar1 + (ulong)((long)((iVar2 - iVar3) + 1) * (long)iVar5) / (ulong)(long)iVar4;
      }
    }
    cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node);
  }
  puVar11 = (bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_start;
  sVar9 = 0;
  for (iVar10 = (pBVar6->min).y; iVar10 <= (pBVar6->max).y; iVar10 = iVar10 + 1) {
    if (sVar9 <= *puVar11) {
      sVar9 = *puVar11;
    }
    puVar11 = puVar11 + 1;
  }
  return sVar9;
}

Assistant:

size_t
bytesPerLineTable (const Header &header,
		   vector<size_t> &bytesPerLine)
{
    const Box2i &dataWindow = header.dataWindow();
    const ChannelList &channels = header.channels();

    bytesPerLine.resize (dataWindow.max.y - dataWindow.min.y + 1);

    for (ChannelList::ConstIterator c = channels.begin();
	 c != channels.end();
	 ++c)
    {
	size_t nBytes = size_t(pixelTypeSize (c.channel().type)) *
		     size_t(dataWindow.max.x - dataWindow.min.x + 1) /
		     size_t(c.channel().xSampling);

	for (int y = dataWindow.min.y, i = 0; y <= dataWindow.max.y; ++y, ++i)
	    if (modp (y, c.channel().ySampling) == 0)
		bytesPerLine[i] += nBytes;
    }

    size_t maxBytesPerLine = 0;

    for (int y = dataWindow.min.y, i = 0; y <= dataWindow.max.y; ++y, ++i)
	if (maxBytesPerLine < bytesPerLine[i])
	    maxBytesPerLine = bytesPerLine[i];

    return maxBytesPerLine;
}